

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,source_extend *extend)

{
  element_type *peVar1;
  pointer pwVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  pair<mjs::source_position,_mjs::source_position> local_48;
  wstring_view local_38;
  long local_28 [2];
  
  peVar1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_str = (peVar1->text_)._M_dataplus._M_p;
  local_38._M_len = (peVar1->text_)._M_string_length;
  local_48 = extend_to_positions(&local_38,extend->start,extend->end);
  peVar1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pwVar2 = (peVar1->filename_)._M_dataplus._M_p;
  local_38._M_len = (size_t)local_28;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_38,pwVar2,pwVar2 + (peVar1->filename_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(char *)local_38._M_len,(long)local_38._M_str);
  if ((long *)local_38._M_len != local_28) {
    operator_delete((void *)local_38._M_len,local_28[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
  pbVar3 = operator<<(os,&local_48.first);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"-",1);
  pbVar3 = operator<<(pbVar3,&local_48.second);
  return pbVar3;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const source_extend& extend) {
        auto [start_pos, end_pos] = extend_to_positions(extend.file->text(), extend.start, extend.end);
        if constexpr (sizeof(CharT) == 1) {
            const auto fn = extend.file->filename();
            os << std::string(fn.begin(), fn.end());
        } else {
            os << extend.file->filename();
        }
        return os << ":" << start_pos << "-" << end_pos;
    }